

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextQueueUndockNode(ImGuiContext *ctx,ImGuiDockNode *node)

{
  int *piVar1;
  int iVar2;
  ImGuiDockContext *pIVar3;
  ImGuiDockRequest *pIVar4;
  ImGuiDockRequest *__dest;
  int iVar5;
  int iVar6;
  uint uStack_3c;
  
  pIVar3 = ctx->DockContext;
  iVar6 = (pIVar3->Requests).Size;
  iVar2 = (pIVar3->Requests).Capacity;
  if (iVar6 == iVar2) {
    iVar6 = iVar6 + 1;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiDockRequest *)(*GImAllocatorAllocFunc)((long)iVar6 << 6,GImAllocatorUserData);
      pIVar4 = (pIVar3->Requests).Data;
      if (pIVar4 != (ImGuiDockRequest *)0x0) {
        memcpy(__dest,pIVar4,(long)(pIVar3->Requests).Size << 6);
        pIVar4 = (pIVar3->Requests).Data;
        if ((pIVar4 != (ImGuiDockRequest *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar3->Requests).Data = __dest;
      (pIVar3->Requests).Capacity = iVar6;
    }
  }
  pIVar4 = (pIVar3->Requests).Data;
  iVar6 = (pIVar3->Requests).Size;
  pIVar4[iVar6].Type = ImGuiDockRequestType_Undock;
  *(ulong *)&pIVar4[iVar6].field_0x4 = (ulong)uStack_3c;
  *(undefined8 *)(&pIVar4[iVar6].field_0x4 + 8) = 0;
  pIVar4[iVar6].DockTargetNode = (ImGuiDockNode *)0x0;
  (&pIVar4[iVar6].DockTargetNode)[1] = (ImGuiDockNode *)0x0;
  pIVar4[iVar6].DockSplitDir = -1;
  pIVar4[iVar6].DockSplitRatio = 0.5;
  pIVar4[iVar6].DockSplitOuter = false;
  pIVar4[iVar6].UndockTargetWindow = (ImGuiWindow *)0x0;
  pIVar4[iVar6].UndockTargetNode = node;
  (pIVar3->Requests).Size = (pIVar3->Requests).Size + 1;
  return;
}

Assistant:

void ImGui::DockContextQueueUndockNode(ImGuiContext* ctx, ImGuiDockNode* node)
{
    ImGuiDockRequest req;
    req.Type = ImGuiDockRequestType_Undock;
    req.UndockTargetNode = node;
    ctx->DockContext->Requests.push_back(req);
}